

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executable.cpp
# Opt level: O0

bool fs_is_exe(string_view path)

{
  string_view path_00;
  bool bVar1;
  perms pVar2;
  perms pVar3;
  string_view local_a0;
  size_t local_90;
  char *local_88;
  path local_80;
  undefined8 local_58;
  file_status s;
  error_code ec;
  perms owner_exec;
  perms group_exec;
  perms others_exec;
  perms none;
  undefined1 local_20 [8];
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  bVar1 = fs_is_file(path);
  if (bVar1) {
    std::error_code::error_code((error_code *)&s);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_80,(basic_string_view<char,_std::char_traits<char>_> *)local_20,auto_format);
    local_58 = std::filesystem::status(&local_80,(error_code *)&s);
    std::filesystem::__cxx11::path::~path(&local_80);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&s);
    if (bVar1) {
      local_90 = (size_t)local_20;
      local_88 = (char *)path_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_a0,"fs_is_exe");
      path_00._M_str = local_88;
      path_00._M_len = local_90;
      fs_print_error(path_00,local_a0,(error_code *)&s);
      path_local._M_str._7_1_ = false;
    }
    else {
      pVar2 = std::filesystem::file_status::permissions((file_status *)&local_58);
      pVar3 = std::filesystem::operator|(owner_exec,group_exec);
      pVar3 = std::filesystem::operator|(pVar3,others_exec);
      pVar2 = std::filesystem::operator&(pVar2,pVar3);
      path_local._M_str._7_1_ = pVar2 != none;
    }
  }
  else {
    path_local._M_str._7_1_ = false;
  }
  return path_local._M_str._7_1_;
}

Assistant:

bool fs_is_exe(std::string_view path)
{
  // is path (file or symlink to a file) executable by the user
  // directories are not considered executable--use fs_get_permissions() for that.

  if(!fs_is_file(path))
    return false;

#if defined(_WIN32)
  std::string suffix = fs_suffix(path);
  if (suffix.empty())
    return fs_is_executable_binary(path);

  if(!fs_is_readable(path))
    return false;

  std::string pathext = fs_getenv("PATHEXT");
  if(pathext.empty())
    pathext = ".com;.exe;.bat;.cmd";
  else
    std::transform(pathext.begin(), pathext.end(), pathext.begin(), ::tolower);

  std::transform(suffix.begin(), suffix.end(), suffix.begin(), ::tolower);
  if(fs_trace) std::cout << "TRACE: is_exe(" << path << "):  suffix: " << suffix << " length " << suffix.length() << " pathext: " << pathext << "\n";

#if defined(__cpp_lib_string_contains) // C++23
  return pathext.contains(suffix);
#else
  return pathext.find(suffix) != std::string::npos;
#endif

#elif defined(HAVE_CXX_FILESYSTEM)

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms none = std::filesystem::perms::none;
  constexpr std::filesystem::perms others_exec = std::filesystem::perms::others_exec;
  constexpr std::filesystem::perms group_exec = std::filesystem::perms::group_exec;
  constexpr std::filesystem::perms owner_exec = std::filesystem::perms::owner_exec;
#endif

  std::error_code ec;
  const auto s = std::filesystem::status(path, ec);
  if(ec){
    fs_print_error(path, __func__, ec);
    return false;
  }

  return (s.permissions() & (owner_exec | group_exec | others_exec)) != none;

#else
  return access(path.data(), X_OK) == 0;
#endif
}